

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O2

void __thiscall
dlib::input_rgb_image::
to_tensor<__gnu_cxx::__normal_iterator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>const*,std::vector<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,std::allocator<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (input_rgb_image *this,
          __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
          ibegin,__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                 iend,resizable_tensor *data)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  ulong nr_;
  ulong nc_;
  rgb_pixel *prVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar7;
  fatal_error *pfVar8;
  long lVar9;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long r;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  i;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  float *pfVar6;
  
  lVar12 = (long)iend._M_current - (long)ibegin._M_current >> 5;
  if (lVar12 < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar7 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x50);
    std::operator<<(poVar7,".\n");
    poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/input.h"
                            );
    std::operator<<(poVar7,".\n");
    poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar7 = std::operator<<(poVar7,
                             "void dlib::input_rgb_image::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                            );
    std::operator<<(poVar7,".\n\n");
    poVar7 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar7 = std::operator<<(poVar7,"std::distance(ibegin,iend) > 0");
    std::operator<<(poVar7,".\n");
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar7 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar7,"\n");
    pfVar8 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar8,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar8,&fatal_error::typeinfo,error::~error);
  }
  nr_ = ((ibegin._M_current)->data).nr_;
  nc_ = ((ibegin._M_current)->data).nc_;
  _Var10._M_current = ibegin._M_current;
  while( true ) {
    if (_Var10._M_current == iend._M_current) {
      resizable_tensor::set_size(data,lVar12,3,nr_,nc_);
      lVar11 = nc_ * nr_;
      iVar5 = (*(data->super_tensor)._vptr_tensor[3])();
      pfVar6 = (float *)CONCAT44(extraout_var,iVar5);
      lVar12 = (data->super_tensor).m_k;
      for (; ibegin._M_current != iend._M_current; ibegin._M_current = ibegin._M_current + 1) {
        lVar13 = 0;
        for (uVar14 = 0; lVar15 = 1, uVar16 = ~((long)nc_ >> 0x3f) & nc_,
            uVar14 != (~((long)nr_ >> 0x3f) & nr_); uVar14 = uVar14 + 1) {
          while (uVar16 != 0) {
            lVar9 = ((ibegin._M_current)->data).nc_ * lVar13;
            prVar4 = ((ibegin._M_current)->data).data;
            bVar2 = (&prVar4->red)[lVar15 + lVar9];
            bVar3 = (&prVar4->green)[lVar15 + lVar9];
            *pfVar6 = ((float)*(byte *)((long)prVar4 + lVar15 + -1 + lVar9) - this->avg_red) *
                      0.00390625;
            pfVar6[lVar11] = ((float)bVar2 - this->avg_green) * 0.00390625;
            pfVar6[lVar11 * 2] = ((float)bVar3 - this->avg_blue) * 0.00390625;
            pfVar6 = pfVar6 + 1;
            lVar15 = lVar15 + 3;
            uVar16 = uVar16 - 1;
          }
          lVar13 = lVar13 + 3;
        }
        pfVar6 = pfVar6 + (lVar12 + -1) * lVar11;
      }
      return;
    }
    if ((((_Var10._M_current)->data).nr_ != nr_) || (((_Var10._M_current)->data).nc_ != nc_)) break;
    _Var10._M_current = _Var10._M_current + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5d);
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/input.h"
                          );
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar7 = std::operator<<(poVar7,
                           "void dlib::input_rgb_image::to_tensor(forward_iterator, forward_iterator, resizable_tensor &) const [forward_iterator = __gnu_cxx::__normal_iterator<const dlib::matrix<dlib::rgb_pixel> *, std::vector<dlib::matrix<dlib::rgb_pixel>>>]"
                          );
  std::operator<<(poVar7,".\n\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar7 = std::operator<<(poVar7,"i->nr()==nr && i->nc()==nc");
  std::operator<<(poVar7,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"\t input_rgb_image::to_tensor()");
  poVar7 = std::operator<<(poVar7,
                           "\n\t All matrices given to to_tensor() must have the same dimensions.");
  poVar7 = std::operator<<(poVar7,"\n\t nr: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\n\t nc: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\n\t i->nr(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\n\t i->nc(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,"\n");
  pfVar8 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar8,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar8,&fatal_error::typeinfo,error::~error);
}

Assistant:

void to_tensor (
            forward_iterator ibegin,
            forward_iterator iend,
            resizable_tensor& data
        ) const
        {
            DLIB_CASSERT(std::distance(ibegin,iend) > 0);
            const auto nr = ibegin->nr();
            const auto nc = ibegin->nc();
            // make sure all the input matrices have the same dimensions
            for (auto i = ibegin; i != iend; ++i)
            {
                DLIB_CASSERT(i->nr()==nr && i->nc()==nc,
                    "\t input_rgb_image::to_tensor()"
                    << "\n\t All matrices given to to_tensor() must have the same dimensions."
                    << "\n\t nr: " << nr
                    << "\n\t nc: " << nc
                    << "\n\t i->nr(): " << i->nr()
                    << "\n\t i->nc(): " << i->nc()
                );
            }


            // initialize data to the right size to contain the stuff in the iterator range.
            data.set_size(std::distance(ibegin,iend), 3, nr, nc);


            const size_t offset = nr*nc;
            auto ptr = data.host();
            for (auto i = ibegin; i != iend; ++i)
            {
                for (long r = 0; r < nr; ++r)
                {
                    for (long c = 0; c < nc; ++c)
                    {
                        rgb_pixel temp = (*i)(r,c);
                        auto p = ptr++;
                        *p = (temp.red-avg_red)/256.0; 
                        p += offset;
                        *p = (temp.green-avg_green)/256.0; 
                        p += offset;
                        *p = (temp.blue-avg_blue)/256.0; 
                        p += offset;
                    }
                }
                ptr += offset*(data.k()-1);
            }

        }